

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateSymbolName
          (DescriptorBuilder *this,string_view name,string_view full_name,Message *proto)

{
  byte bVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  size_t sVar2;
  size_t local_18;
  char *local_10;
  size_t *local_8;
  
  local_10 = name._M_str;
  local_18 = name._M_len;
  if (local_18 == 0) {
    AddError(this,full_name,proto,NAME,"Missing name.");
    return;
  }
  sVar2 = 0;
  while( true ) {
    if (local_18 == sVar2) {
      return;
    }
    bVar1 = local_10[sVar2];
    if (((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6) && (bVar1 != 0x5f && (byte)(bVar1 - 0x3a) < 0xf6))
    break;
    sVar2 = sVar2 + 1;
  }
  local_8 = &local_18;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::ValidateSymbolName(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = &local_8;
  AddError(this,full_name,proto,NAME,make_error);
  return;
}

Assistant:

void DescriptorBuilder::ValidateSymbolName(const absl::string_view name,
                                           const absl::string_view full_name,
                                           const Message& proto) {
  if (name.empty()) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
             "Missing name.");
  } else {
    for (char character : name) {
      // I don't trust isalnum() due to locales.  :(
      if ((character < 'a' || 'z' < character) &&
          (character < 'A' || 'Z' < character) &&
          (character < '0' || '9' < character) && (character != '_')) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", name, "\" is not a valid identifier.");
        });
        return;
      }
    }
  }
}